

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

int __thiscall rw::ColorQuant::init(ColorQuant *this,EVP_PKEY_CTX *ctx)

{
  Node *pNVar1;
  
  (this->leaves).link.next = &(this->leaves).link;
  (this->leaves).link.prev = &(this->leaves).link;
  pNVar1 = createNode(this,8);
  this->root = pNVar1;
  return (int)pNVar1;
}

Assistant:

void
ColorQuant::init(void)
{
	this->leaves.init();
	this->root = this->createNode(QUANTDEPTH);
}